

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_123::AggregateConnectionReceiver::setsockopt
          (AggregateConnectionReceiver *this,int __fd,int __level,int __optname,void *__optval,
          socklen_t __optlen)

{
  Own<kj::ConnectionReceiver,_std::nullptr_t> *pOVar1;
  ConnectionReceiver *pCVar2;
  undefined4 in_register_0000000c;
  Own<kj::ConnectionReceiver,_std::nullptr_t> *r;
  Own<kj::ConnectionReceiver,_std::nullptr_t> *__end2;
  Own<kj::ConnectionReceiver,_std::nullptr_t> *__begin2;
  Array<kj::Own<kj::ConnectionReceiver,_std::nullptr_t>_> *__range2;
  uint length_local;
  void *value_local;
  int option_local;
  int level_local;
  AggregateConnectionReceiver *this_local;
  
  __end2 = Array<kj::Own<kj::ConnectionReceiver,_std::nullptr_t>_>::begin(&this->receivers);
  pOVar1 = Array<kj::Own<kj::ConnectionReceiver,_std::nullptr_t>_>::end(&this->receivers);
  for (; __end2 != pOVar1; __end2 = __end2 + 1) {
    pCVar2 = Own<kj::ConnectionReceiver,_std::nullptr_t>::operator->(__end2);
    (*pCVar2->_vptr_ConnectionReceiver[4])
              (pCVar2,(ulong)(uint)__fd,(ulong)(uint)__level,
               CONCAT44(in_register_0000000c,__optname),(ulong)__optval & 0xffffffff);
  }
  return (int)__end2;
}

Assistant:

void setsockopt(int level, int option, const void* value, uint length) override {
    // Apply to all.
    for (auto& r: receivers) {
      r->setsockopt(level, option, value, length);
    }
  }